

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcLoad.c
# Opt level: O0

int Bmc_LoadGetSatVar(Bmc_Load_t *p,int Id)

{
  sat_solver *s;
  uint uVar1;
  int n;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj;
  int Id_local;
  Bmc_Load_t *p_local;
  
  pGVar2 = Gia_ManObj(p->pGia,Id);
  if (pGVar2->Value == 0) {
    uVar1 = Vec_IntSize(p->vSat2Id);
    pGVar2->Value = uVar1;
    Vec_IntPush(p->vSat2Id,Id);
    s = p->pSat;
    n = Vec_IntSize(p->vSat2Id);
    sat_solver_setnvars(s,n);
  }
  return pGVar2->Value;
}

Assistant:

int Bmc_LoadGetSatVar( Bmc_Load_t * p, int Id )
{
    Gia_Obj_t * pObj = Gia_ManObj( p->pGia, Id );
    if ( pObj->Value == 0 )
    {
        pObj->Value = Vec_IntSize( p->vSat2Id );
        Vec_IntPush( p->vSat2Id, Id );
        sat_solver_setnvars( p->pSat, Vec_IntSize(p->vSat2Id) );
    }
    return pObj->Value;
}